

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet,int iCursor)

{
  int local_20;
  int i;
  int iCursor_local;
  WhereMaskSet *pMaskSet_local;
  
  local_20 = 0;
  while( true ) {
    if (pMaskSet->n <= local_20) {
      return 0;
    }
    if (pMaskSet->ix[local_20] == iCursor) break;
    local_20 = local_20 + 1;
  }
  return 1L << ((byte)local_20 & 0x3f);
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereGetMask(WhereMaskSet *pMaskSet, int iCursor){
  int i;
  assert( pMaskSet->n<=(int)sizeof(Bitmask)*8 );
  for(i=0; i<pMaskSet->n; i++){
    if( pMaskSet->ix[i]==iCursor ){
      return MASKBIT(i);
    }
  }
  return 0;
}